

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_trace.cpp
# Opt level: O1

void __thiscall FTraceInfo::Setup3DFloors(FTraceInfo *this)

{
  double dVar1;
  double dVar2;
  extsector_t *peVar3;
  F3DFloor **ppFVar4;
  F3DFloor *pFVar5;
  secplane_t *psVar6;
  FTraceResults *pFVar7;
  sector_t_conflict *psVar8;
  bool bVar9;
  uint *puVar10;
  long lVar11;
  ulong uVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  
  peVar3 = this->CurSector->e;
  if ((peVar3->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Count != 0) {
    memcpy(this->DummySector,this->CurSector,0x218);
    this->CurSector = this->DummySector;
    this->sectorsel = 1;
    uVar12 = (ulong)(peVar3->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Count;
    if (uVar12 != 0) {
      dVar15 = this->MaxDist * this->startfrac;
      dVar17 = (this->Vec).X * dVar15 + (this->Start).X;
      dVar18 = (this->Vec).Y * dVar15 + (this->Start).Y;
      dVar16 = dVar15 * (this->Vec).Z + (this->Start).Z;
      dVar19 = (this->DummySector[0].ceilingplane.normal.Y * dVar18 +
               this->DummySector[0].ceilingplane.normal.X * dVar17 +
               this->DummySector[0].ceilingplane.D) * this->DummySector[0].ceilingplane.negiC;
      dVar15 = (this->DummySector[0].floorplane.normal.Y * dVar18 +
               this->DummySector[0].floorplane.normal.X * dVar17 + this->DummySector[0].floorplane.D
               ) * this->DummySector[0].floorplane.negiC;
      ppFVar4 = (peVar3->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Array;
      lVar11 = 0;
      do {
        pFVar5 = *(F3DFloor **)((long)ppFVar4 + lVar11);
        if ((pFVar5->flags & 1) != 0) {
          if ((((pFVar5->flags & 0x10) != 0) && (this->Results->Crossed3DWater == (F3DFloor *)0x0))
             && (bVar9 = CheckPlane(this,(pFVar5->top).plane), bVar9)) {
            psVar6 = (pFVar5->top).plane;
            pFVar7 = this->Results;
            dVar1 = (pFVar7->HitPos).X;
            dVar2 = (pFVar7->HitPos).Y;
            if (dVar15 < ((psVar6->normal).Y * dVar2 + (psVar6->normal).X * dVar1 + psVar6->D) *
                         psVar6->negiC) {
              pFVar7->Crossed3DWater = pFVar5;
              (pFVar7->Crossed3DWaterPos).Z = (pFVar7->HitPos).Z;
              (pFVar7->Crossed3DWaterPos).Y = dVar2;
              (pFVar7->Crossed3DWaterPos).X = dVar1;
              pFVar7->Distance = 0.0;
            }
          }
          if ((pFVar5->flags & 0x4000000) == 0) {
            psVar6 = (pFVar5->top).plane;
            dVar1 = (psVar6->normal).X;
            dVar2 = (psVar6->normal).Y;
            dVar13 = (dVar18 * dVar2 + dVar17 * dVar1 + psVar6->D) * psVar6->negiC;
            if (dVar16 <= dVar13) {
              psVar6 = (pFVar5->bottom).plane;
              dVar1 = (psVar6->normal).X;
              dVar2 = (psVar6->normal).Y;
              dVar14 = (dVar18 * dVar2 + dVar17 * dVar1 + psVar6->D) * psVar6->negiC;
              if (dVar14 <= dVar16) {
                if (dVar15 < dVar14) {
                  psVar8 = this->CurSector;
                  (psVar8->floorplane).normal.Z = (psVar6->normal).Z;
                  (psVar8->floorplane).normal.Y = dVar2;
                  (psVar8->floorplane).normal.X = dVar1;
                  dVar15 = psVar6->negiC;
                  (psVar8->floorplane).D = psVar6->D;
                  (psVar8->floorplane).negiC = dVar15;
                  psVar8 = this->CurSector;
                  psVar8->planes[0].Texture.texnum = ((pFVar5->bottom).texture)->texnum;
                  psVar8->Portals[0] = 0;
                  dVar15 = dVar14;
                }
                puVar10 = (uint *)&this->inshootthrough;
                if (dVar13 < dVar19) {
                  psVar6 = (pFVar5->top).plane;
                  psVar8 = this->CurSector;
                  (psVar8->ceilingplane).normal.Z = (psVar6->normal).Z;
                  (psVar8->ceilingplane).normal.Y = (psVar6->normal).Y;
                  (psVar8->ceilingplane).normal.X = (psVar6->normal).X;
                  dVar19 = psVar6->negiC;
                  (psVar8->ceilingplane).D = psVar6->D;
                  (psVar8->ceilingplane).negiC = dVar19;
                  psVar8 = this->CurSector;
                  psVar8->planes[1].Texture.texnum = ((pFVar5->top).texture)->texnum;
                  psVar8->Portals[1] = 0;
                  dVar19 = dVar13;
                }
              }
              else {
                if (dVar19 <= dVar14) goto LAB_0045f0c4;
                psVar8 = this->CurSector;
                (psVar8->ceilingplane).normal.Z = (psVar6->normal).Z;
                (psVar8->ceilingplane).normal.Y = dVar2;
                (psVar8->ceilingplane).normal.X = dVar1;
                dVar19 = psVar6->negiC;
                (psVar8->ceilingplane).D = psVar6->D;
                (psVar8->ceilingplane).negiC = dVar19;
                psVar8 = this->CurSector;
                psVar8->planes[1].Texture.texnum = ((pFVar5->bottom).texture)->texnum;
                puVar10 = psVar8->Portals + 1;
                dVar19 = dVar14;
              }
            }
            else {
              if (dVar13 <= dVar15) goto LAB_0045f0c4;
              psVar8 = this->CurSector;
              (psVar8->floorplane).normal.Z = (psVar6->normal).Z;
              (psVar8->floorplane).normal.Y = dVar2;
              (psVar8->floorplane).normal.X = dVar1;
              dVar15 = psVar6->negiC;
              (psVar8->floorplane).D = psVar6->D;
              (psVar8->floorplane).negiC = dVar15;
              psVar8 = this->CurSector;
              psVar8->planes[0].Texture.texnum = ((pFVar5->top).texture)->texnum;
              puVar10 = psVar8->Portals;
              dVar15 = dVar13;
            }
            *puVar10 = 0;
          }
        }
LAB_0045f0c4:
        lVar11 = lVar11 + 8;
      } while (uVar12 << 3 != lVar11);
    }
  }
  return;
}

Assistant:

void FTraceInfo::Setup3DFloors()
{
	TDeletingArray<F3DFloor*> &ff = CurSector->e->XFloor.ffloors;

	if (ff.Size())
	{
		memcpy(&DummySector[0], CurSector, sizeof(sector_t));
		CurSector = &DummySector[0];
		sectorsel = 1;

		double sdist = MaxDist * startfrac;
		DVector3 pos = Start + Vec * sdist;


		double bf = CurSector->floorplane.ZatPoint(pos);
		double bc = CurSector->ceilingplane.ZatPoint(pos);

		for (auto rover : ff)
		{
			if (!(rover->flags&FF_EXISTS))
				continue;

			if (rover->flags&FF_SWIMMABLE && Results->Crossed3DWater == NULL)
			{
				if (Check3DFloorPlane(rover, false))
				{
					// only consider if the plane is above the actual floor.
					if (rover->top.plane->ZatPoint(Results->HitPos) > bf)
					{
						Results->Crossed3DWater = rover;
						Results->Crossed3DWaterPos = Results->HitPos;
						Results->Distance = 0;
					}
				}
			}

			if (!(rover->flags&FF_SHOOTTHROUGH))
			{
				double ff_bottom = rover->bottom.plane->ZatPoint(pos);
				double ff_top = rover->top.plane->ZatPoint(pos);
				// clip to the part of the sector we are in
				if (pos.Z > ff_top)
				{
					// above
					if (bf < ff_top)
					{
						CurSector->floorplane = *rover->top.plane;
						CurSector->SetTexture(sector_t::floor, *rover->top.texture, false);
						CurSector->ClearPortal(sector_t::floor);
						bf = ff_top;
					}
				}
				else if (pos.Z < ff_bottom)
				{
					//below
					if (bc > ff_bottom)
					{
						CurSector->ceilingplane = *rover->bottom.plane;
						CurSector->SetTexture(sector_t::ceiling, *rover->bottom.texture, false);
						bc = ff_bottom;
						CurSector->ClearPortal(sector_t::ceiling);
					}
				}
				else
				{
					// inside
					if (bf < ff_bottom)
					{
						CurSector->floorplane = *rover->bottom.plane;
						CurSector->SetTexture(sector_t::floor, *rover->bottom.texture, false);
						CurSector->ClearPortal(sector_t::floor);
						bf = ff_bottom;
					}

					if (bc > ff_top)
					{
						CurSector->ceilingplane = *rover->top.plane;
						CurSector->SetTexture(sector_t::ceiling, *rover->top.texture, false);
						CurSector->ClearPortal(sector_t::ceiling);
						bc = ff_top;
					}
					inshootthrough = false;
				}
			}
		}
	}
}